

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O1

FL_BLINE * __thiscall Fl_Browser::_remove(Fl_Browser *this,int line)

{
  FL_BLINE *pFVar1;
  int iVar2;
  FL_BLINE *item;
  FL_BLINE *pFVar3;
  FL_BLINE **ppFVar4;
  
  item = find_line(this,line);
  Fl_Browser_::deleting(&this->super_Fl_Browser_,item);
  this->cacheline = line + -1;
  this->cache = item->prev;
  this->lines = this->lines + -1;
  iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                    (this,item);
  this->full_height_ = this->full_height_ - iVar2;
  pFVar1 = item->prev;
  ppFVar4 = &pFVar1->next;
  if (pFVar1 == (FL_BLINE *)0x0) {
    ppFVar4 = &this->first;
  }
  *ppFVar4 = item->next;
  pFVar3 = (FL_BLINE *)&this->last;
  if (item->next != (FL_BLINE *)0x0) {
    pFVar3 = item->next;
  }
  pFVar3->prev = pFVar1;
  return item;
}

Assistant:

FL_BLINE* Fl_Browser::_remove(int line) {
  FL_BLINE* ttt = find_line(line);
  deleting(ttt);

  cacheline = line-1;
  cache = ttt->prev;
  lines--;
  full_height_ -= item_height(ttt);
  if (ttt->prev) ttt->prev->next = ttt->next;
  else first = ttt->next;
  if (ttt->next) ttt->next->prev = ttt->prev;
  else last = ttt->prev;

  return(ttt);
}